

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
deleteNode(UA_Server *server,UA_Session *session,UA_NodeId *nodeId,UA_Boolean deleteReferences)

{
  size_t *psVar1;
  undefined8 *puVar2;
  UA_NodeStoreEntry *pUVar3;
  code *pcVar4;
  undefined8 uVar5;
  UA_ReferenceNode *pUVar6;
  UA_StatusCode UVar7;
  UA_NodeStoreEntry **ppUVar8;
  UA_Node *pUVar9;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 uVar10;
  undefined4 extraout_EDX_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 uVar11;
  undefined4 extraout_var_02;
  long lVar12;
  ulong uVar13;
  size_t local_a8;
  UA_Byte *pUStack_a0;
  size_t local_98;
  UA_Byte *local_90;
  size_t sStack_88;
  UA_Byte *local_80;
  size_t local_78;
  UA_Byte *pUStack_70;
  size_t local_68;
  UA_Byte *pUStack_60;
  UA_Byte *local_58;
  size_t sStack_50;
  UA_Byte *local_48;
  size_t sStack_40;
  UA_Session *local_38;
  
  ppUVar8 = findNode(server->nodestore,(UA_NodeId *)session);
  if (ppUVar8 == (UA_NodeStoreEntry **)0x0) {
    return 0x80340000;
  }
  pUVar3 = *ppUVar8;
  uVar10 = extraout_EDX;
  uVar11 = extraout_var;
  if (((((pUVar3->node).nodeClass == UA_NODECLASS_OBJECT) &&
       (pUVar9 = getNodeType(server,&pUVar3->node), uVar10 = extraout_EDX_00,
       uVar11 = extraout_var_00, pUVar9 != (UA_Node *)0x0)) &&
      (pUVar9->nodeClass == UA_NODECLASS_OBJECTTYPE)) &&
     (pcVar4 = (code *)pUVar9[1].nodeId.identifier.string.data, pcVar4 != (code *)0x0)) {
    uVar5._0_2_ = pUVar3[1].node.nodeId.namespaceIndex;
    uVar5._2_2_ = *(undefined2 *)&pUVar3[1].node.nodeId.field_0x2;
    uVar5._4_4_ = pUVar3[1].node.nodeId.identifierType;
    (*pcVar4)(uVar5);
    uVar10 = extraout_EDX_01;
    uVar11 = extraout_var_01;
  }
  if ((char)nodeId != '\0') {
    local_48 = (UA_Byte *)0x0;
    sStack_40 = 0;
    local_58 = (UA_Byte *)0x0;
    sStack_50 = 0;
    local_78 = 0;
    pUStack_60 = (pUVar3->node).nodeId.identifier.string.data;
    pUStack_70 = *(UA_Byte **)&(pUVar3->node).nodeId;
    local_68 = (pUVar3->node).nodeId.identifier.string.length;
    local_38 = session;
    if ((pUVar3->node).referencesSize != 0) {
      lVar12 = 0x20;
      uVar13 = 0;
      do {
        pUVar6 = (pUVar3->node).references;
        local_78 = CONCAT71(local_78._1_7_,*(undefined1 *)((long)pUVar6 + lVar12 + -8));
        local_98 = *(size_t *)((long)&(pUVar6->referenceTypeId).identifier + lVar12 + 8);
        psVar1 = (size_t *)((long)&(pUVar6->referenceTypeId).namespaceIndex + lVar12);
        local_a8 = *psVar1;
        pUStack_a0 = (UA_Byte *)psVar1[1];
        local_80 = *(UA_Byte **)((long)pUVar6 + lVar12 + -0x10);
        puVar2 = (undefined8 *)((long)pUVar6 + lVar12 + -0x20);
        local_90 = (UA_Byte *)*puVar2;
        sStack_88 = puVar2[1];
        deleteReference(server,(UA_Session *)&stack0xffffffffffffff58,
                        (UA_DeleteReferencesItem *)CONCAT44(uVar11,uVar10));
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + 0x50;
        uVar10 = extraout_EDX_02;
        uVar11 = extraout_var_02;
        session = local_38;
      } while (uVar13 < (pUVar3->node).referencesSize);
    }
  }
  UVar7 = UA_NodeStore_remove(server->nodestore,(UA_NodeId *)session);
  return UVar7;
}

Assistant:

static UA_StatusCode
deleteNode(UA_Server *server, UA_Session *session,
           const UA_NodeId *nodeId, UA_Boolean deleteReferences) {
    const UA_Node *node = UA_NodeStore_get(server->nodestore, nodeId);
    if(!node)
        return UA_STATUSCODE_BADNODEIDUNKNOWN;

    /* TODO: check if the information model consistency is violated */
    /* TODO: Check if the node is a mandatory child of an object */

    /* Destroy an object before removing it */
    if(node->nodeClass == UA_NODECLASS_OBJECT) {
        /* Call the destructor from the object type */
        const UA_ObjectTypeNode *typenode = getObjectNodeType(server, (const UA_ObjectNode*)node);
        if(typenode && typenode->lifecycleManagement.destructor)
            typenode->lifecycleManagement.destructor(*nodeId, ((const UA_ObjectNode*)node)->instanceHandle);
    }

    /* Remove references to the node (not the references in the node that will
     * be deleted anyway) */
    if(deleteReferences)
        removeReferences(server, session, node);

    return UA_NodeStore_remove(server->nodestore, nodeId);
}